

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSExportEntry *
add_export_entry2(JSContext *ctx,JSParseState *s,JSModuleDef *m,JSAtom param_4,JSAtom export_name,
                 JSExportTypeEnum export_type)

{
  JSExportEntry *pJVar1;
  JSExportEntry *pJVar2;
  JSAtomStruct *pJVar3;
  JSExportEntry *pJVar4;
  int iVar5;
  char *pcVar6;
  JSAtom atom;
  long lVar7;
  long lVar8;
  char buf1 [64];
  char acStack_78 [72];
  
  iVar5 = m->export_entries_count;
  if (0 < (long)iVar5) {
    lVar7 = (long)iVar5 << 5;
    lVar8 = 0;
    do {
      if (*(JSAtom *)((long)&m->export_entries->export_name + lVar8) == export_name) {
        atom = (JSAtom)lVar7;
        if (s != (JSParseState *)0x0) {
          pcVar6 = JS_AtomGetStrRT(ctx->rt,acStack_78,export_name,atom);
          js_parse_error(s,"duplicate exported name \'%s\'",pcVar6);
          return (JSExportEntry *)0x0;
        }
        pcVar6 = JS_AtomGetStrRT(ctx->rt,acStack_78,export_name,atom);
        JS_ThrowSyntaxError(ctx,"duplicate exported name \'%s\'",pcVar6);
        return (JSExportEntry *)0x0;
      }
      lVar8 = lVar8 + 0x20;
    } while (lVar7 != lVar8);
  }
  if (m->export_entries_size <= iVar5) {
    iVar5 = js_realloc_array(ctx,&m->export_entries,0x20,&m->export_entries_size,iVar5 + 1);
    if (iVar5 != 0) {
      return (JSExportEntry *)0x0;
    }
    iVar5 = m->export_entries_count;
  }
  pJVar2 = m->export_entries;
  m->export_entries_count = iVar5 + 1;
  pJVar1 = pJVar2 + iVar5;
  pJVar4 = pJVar2 + iVar5;
  pJVar4->export_type = JS_EXPORT_TYPE_LOCAL;
  pJVar4->local_name = 0;
  *(undefined8 *)(&pJVar4->export_type + 2) = 0;
  *(undefined8 *)&pJVar2[iVar5].u = 0;
  pJVar2[iVar5].u.local.var_ref = (JSVarRef *)0x0;
  if (0xd1 < (int)param_4) {
    pJVar3 = ctx->rt->atom_array[param_4];
    (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
  }
  pJVar1->local_name = param_4;
  if (0xd1 < (int)export_name) {
    pJVar3 = ctx->rt->atom_array[export_name];
    (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
  }
  pJVar1->export_name = export_name;
  pJVar1->export_type = export_type;
  return pJVar1;
}

Assistant:

static JSExportEntry *add_export_entry2(JSContext *ctx,
                                        JSParseState *s, JSModuleDef *m,
                                       JSAtom local_name, JSAtom export_name,
                                       JSExportTypeEnum export_type)
{
    JSExportEntry *me;

    if (find_export_entry(ctx, m, export_name)) {
        char buf1[ATOM_GET_STR_BUF_SIZE];
        if (s) {
            js_parse_error(s, "duplicate exported name '%s'",
                           JS_AtomGetStr(ctx, buf1, sizeof(buf1), export_name));
        } else {
            JS_ThrowSyntaxErrorAtom(ctx, "duplicate exported name '%s'", export_name);
        }
        return NULL;
    }

    if (js_resize_array(ctx, (void **)&m->export_entries,
                        sizeof(JSExportEntry),
                        &m->export_entries_size,
                        m->export_entries_count + 1))
        return NULL;
    me = &m->export_entries[m->export_entries_count++];
    memset(me, 0, sizeof(*me));
    me->local_name = JS_DupAtom(ctx, local_name);
    me->export_name = JS_DupAtom(ctx, export_name);
    me->export_type = export_type;
    return me;
}